

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent *indent,string *toDestDirPath)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  bool local_f2;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  string *local_28;
  string *toDestDirPath_local;
  Indent *indent_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  
  local_28 = toDestDirPath;
  toDestDirPath_local = (string *)indent;
  indent_local = (Indent *)os;
  os_local = (ostream *)this;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar2 != STATIC_LIBRARY) && ((this->ImportLibrary & 1U) == 0)) {
    pcVar3 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    local_82 = 0;
    local_83 = 0;
    std::__cxx11::string::string((string *)&local_48,"APPLE",&local_49);
    bVar1 = cmMakefile::IsOn(pcVar3,&local_48);
    local_f2 = false;
    if (bVar1) {
      this_00 = this->Target;
      std::allocator<char>::allocator();
      local_82 = 1;
      std::__cxx11::string::string((string *)&local_80,"MACOSX_BUNDLE",&local_81);
      local_83 = 1;
      local_f2 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_80);
    }
    if ((local_83 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((local_82 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (local_f2 == false) {
      pcVar3 = cmTarget::GetMakefile(this->Target->Target);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_a8,"CMAKE_STRIP",&local_a9);
      bVar1 = cmMakefile::IsSet(pcVar3,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        poVar4 = ::operator<<((ostream *)indent_local,(cmScriptGeneratorIndent *)toDestDirPath_local
                             );
        std::operator<<(poVar4,"if(CMAKE_INSTALL_DO_STRIP)\n");
        poVar4 = ::operator<<((ostream *)indent_local,(cmScriptGeneratorIndent *)toDestDirPath_local
                             );
        poVar4 = std::operator<<(poVar4,"  execute_process(COMMAND \"");
        pcVar3 = cmTarget::GetMakefile(this->Target->Target);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_d0,"CMAKE_STRIP",&local_d1);
        pcVar5 = cmMakefile::GetDefinition(pcVar3,&local_d0);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" \"");
        poVar4 = std::operator<<(poVar4,(string *)local_28);
        std::operator<<(poVar4,"\")\n");
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        poVar4 = ::operator<<((ostream *)indent_local,(cmScriptGeneratorIndent *)toDestDirPath_local
                             );
        std::operator<<(poVar4,"endif()\n");
      }
    }
  }
  return;
}

Assistant:

void
cmInstallTargetGenerator::AddStripRule(std::ostream& os,
                                       Indent const& indent,
                                       const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if(this->Target->GetType()==cmState::STATIC_LIBRARY || this->ImportLibrary)
    {
    return;
    }

  // Don't handle OSX Bundles.
  if(this->Target->Target->GetMakefile()->IsOn("APPLE") &&
     this->Target->GetPropertyAsBool("MACOSX_BUNDLE"))
    {
    return;
    }

  if(! this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP"))
    {
    return;
    }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetDefinition("CMAKE_STRIP")
     << "\" \"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}